

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O2

void __thiscall
duckdb::WriteOverflowStringsToDisk::WriteString
          (WriteOverflowStringsToDisk *this,UncompressedStringSegmentState *state,string_t string,
          block_id_t *result_block,int32_t *result_offset)

{
  BufferHandle *this_00;
  BufferManager *pBVar1;
  bool bVar2;
  int iVar3;
  BlockManager *pBVar4;
  idx_t iVar5;
  undefined4 extraout_var;
  data_ptr_t pdVar6;
  idx_t iVar7;
  undefined4 extraout_var_00;
  char *__src;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  size_t __n;
  string_t string_local;
  BufferHandle local_48;
  
  uVar9 = string.value._0_8_;
  string_local.value._0_8_ = uVar9;
  string_local.value.pointer.ptr = string.value._8_8_;
  pBVar4 = PartialBlockManager::GetBlockManager(this->partial_block_manager);
  pBVar1 = pBVar4->buffer_manager;
  this_00 = &this->handle;
  bVar2 = BufferHandle::IsValid(this_00);
  if (!bVar2) {
    (*pBVar1->_vptr_BufferManager[5])(&local_48,pBVar1,8,pBVar4,1);
    BufferHandle::operator=(this_00,&local_48);
    BufferHandle::~BufferHandle(&local_48);
  }
  if ((this->block_id == -1) ||
     (iVar7 = this->offset, iVar5 = GetStringSpace(this), iVar5 <= iVar7 + 8)) {
    iVar3 = (*pBVar4->_vptr_BlockManager[4])(pBVar4);
    AllocateNewBlock(this,state,CONCAT44(extraout_var,iVar3));
  }
  *result_block = this->block_id;
  *result_offset = (int32_t)this->offset;
  pdVar6 = BufferHandle::Ptr(this_00);
  *(uint *)(pdVar6 + this->offset) = string.value._0_4_;
  this->offset = this->offset + 4;
  __src = string.value._8_8_;
  if (string.value._0_4_ < 0xd) {
    __src = string_local.value.pointer.prefix;
  }
LAB_01a0e9d6:
  uVar8 = (uint)uVar9;
  if (uVar8 == 0) {
    return;
  }
  iVar7 = GetStringSpace(this);
  uVar10 = (int)iVar7 - (int)this->offset;
  if (uVar10 != 0) goto code_r0x01a0e9ef;
  goto LAB_01a0ea20;
code_r0x01a0e9ef:
  __n = (size_t)uVar10;
  if (uVar8 < uVar10) {
    __n = uVar9 & 0xffffffff;
  }
  switchD_016b0717::default(pdVar6 + this->offset,__src,__n);
  this->offset = this->offset + __n;
  __src = __src + __n;
  uVar9 = 0;
  uVar8 = uVar8 - (int)__n;
  if (uVar8 != 0) {
LAB_01a0ea20:
    iVar3 = (*pBVar4->_vptr_BlockManager[4])(pBVar4);
    AllocateNewBlock(this,state,CONCAT44(extraout_var_00,iVar3));
    uVar9 = (ulong)uVar8;
  }
  goto LAB_01a0e9d6;
}

Assistant:

void WriteOverflowStringsToDisk::WriteString(UncompressedStringSegmentState &state, string_t string,
                                             block_id_t &result_block, int32_t &result_offset) {
	auto &block_manager = partial_block_manager.GetBlockManager();
	auto &buffer_manager = block_manager.buffer_manager;
	if (!handle.IsValid()) {
		handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, &block_manager);
	}
	// first write the length of the string
	if (block_id == INVALID_BLOCK || offset + 2 * sizeof(uint32_t) >= GetStringSpace()) {
		AllocateNewBlock(state, block_manager.GetFreeBlockId());
	}
	result_block = block_id;
	result_offset = UnsafeNumericCast<int32_t>(offset);

	// write the length field
	auto data_ptr = handle.Ptr();
	auto string_length = string.GetSize();
	Store<uint32_t>(UnsafeNumericCast<uint32_t>(string_length), data_ptr + offset);
	offset += sizeof(uint32_t);

	// now write the remainder of the string
	auto strptr = string.GetData();
	auto remaining = UnsafeNumericCast<uint32_t>(string_length);
	while (remaining > 0) {
		uint32_t to_write = MinValue<uint32_t>(remaining, UnsafeNumericCast<uint32_t>(GetStringSpace() - offset));
		if (to_write > 0) {
			memcpy(data_ptr + offset, strptr, to_write);

			remaining -= to_write;
			offset += to_write;
			strptr += to_write;
		}
		if (remaining > 0) {
			D_ASSERT(offset == GetStringSpace());
			// there is still remaining stuff to write
			// now write the current block to disk and allocate a new block
			AllocateNewBlock(state, block_manager.GetFreeBlockId());
		}
	}
}